

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_server2.c
# Opt level: O1

int psk_callback(void *p_info,mbedtls_ssl_context *ssl,uchar *name,size_t name_len)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  
  if (p_info != (void *)0x0) {
    do {
      __s = *p_info;
      sVar2 = strlen(__s);
      if ((sVar2 == name_len) && (iVar1 = bcmp(name,__s,name_len), iVar1 == 0)) {
        iVar1 = mbedtls_ssl_set_hs_psk
                          (ssl,(uchar *)((long)p_info + 0x10),*(size_t *)((long)p_info + 8));
        return iVar1;
      }
      p_info = *(void **)((long)p_info + 0x30);
    } while ((undefined8 *)p_info != (undefined8 *)0x0);
  }
  return -1;
}

Assistant:

int psk_callback( void *p_info, mbedtls_ssl_context *ssl,
                  const unsigned char *name, size_t name_len )
{
    psk_entry *cur = (psk_entry *) p_info;

    while( cur != NULL )
    {
        if( name_len == strlen( cur->name ) &&
            memcmp( name, cur->name, name_len ) == 0 )
        {
            return( mbedtls_ssl_set_hs_psk( ssl, cur->key, cur->key_len ) );
        }

        cur = cur->next;
    }

    return( -1 );
}